

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chromaclique.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  locale *this;
  _Base_ptr *pp_Var1;
  _Rb_tree_header *p_Var2;
  bool bVar3;
  _Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  _Var4;
  Kind KVar5;
  pointer pbVar6;
  _Alloc_hider _Var7;
  _Elt_pointer ppAVar8;
  AlignmentRecord *this_00;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  _Base_ptr *pp_Var13;
  vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_> *pvVar14;
  char cVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  ostream *poVar19;
  _Rb_tree_node_base *p_Var20;
  mapped_type *pmVar21;
  int *piVar22;
  _Map_pointer pppAVar23;
  long lVar24;
  istream *piVar25;
  ctype *pcVar26;
  mapped_type *pmVar27;
  clock_t cVar28;
  _Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *this_01;
  NoMeEdgeCalculator *pNVar29;
  GaussianEdgeCalculator *this_02;
  LogWriter *pLVar30;
  CLEVER *this_03;
  _Elt_pointer ppAVar31;
  long *plVar32;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var33;
  iterator iVar34;
  mapped_type *pmVar35;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar36;
  size_type sVar37;
  _Base_ptr p_Var38;
  _Base_ptr p_Var39;
  undefined8 uVar40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar41;
  _Alloc_hider *p_Var42;
  long *plVar43;
  undefined1 *puVar44;
  _Rb_tree_header *p_Var45;
  _Base_ptr p_Var46;
  size_type *psVar47;
  _Base_ptr p_Var48;
  undefined1 *puVar49;
  _Elt_pointer ppAVar50;
  map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *pmVar51;
  pointer pbVar52;
  pointer pcVar53;
  key_type *pkVar54;
  deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *__range1;
  undefined1 auVar55 [8];
  AlignmentRecord **r;
  uint uVar56;
  size_type sVar57;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar58;
  byte bVar59;
  int iVar60;
  string outfile;
  string mean_and_sd_filename;
  string allel_frequencies_path;
  string bamfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  consistingReads_1;
  int nonEdgeCounter;
  int edgecounter;
  uint maxPosition1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
  args;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  trueReadsUniqueSupportMap;
  unique_ptr<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>,_std::default_delete<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>_>_>
  readgroup_params;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> trueReadsSupportMap;
  string indel_output_file;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  readCountMap;
  ofstream os;
  string logfile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  originalReadNames;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> errorReadsSupportMap;
  RefVector references;
  string reference_path;
  string indel_edge_cutoff;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  errorReadsUniqueSupportMap;
  CliqueCollector collector;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  appearanceMap;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  simpson_map;
  string ia_line;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  switchRateRS;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  switchRateFS;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insertion_words;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  ofstream osSupportTrue;
  SamHeader header;
  undefined1 *local_1100;
  long local_10f8;
  undefined1 local_10f0 [16];
  string local_10e0;
  char *local_10c0;
  long local_10b8;
  char local_10b0 [16];
  undefined1 *local_10a0;
  long local_1098;
  undefined1 local_1090 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1080;
  char local_1072;
  byte local_1071;
  pointer local_1070;
  LogWriter *local_1068;
  key_type local_1060;
  _Map_pointer local_1040;
  undefined1 local_1038 [36];
  int local_1014;
  int local_1010;
  uint local_100c;
  long *local_1008;
  map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *local_1000;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
  local_ff8;
  undefined1 local_fc8 [8];
  undefined1 local_fc0 [24];
  _Base_ptr local_fa8;
  size_t local_fa0;
  double local_f98;
  vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_> *local_f90;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_f88;
  char *local_f58;
  map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *local_f50;
  char local_f48 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_f38;
  long local_f08;
  undefined1 local_f00 [8];
  size_type local_ef8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ef0;
  undefined1 local_ee0 [8];
  undefined1 local_ed8 [208];
  ios_base local_e08 [272];
  undefined1 *local_cf8;
  long local_cf0;
  undefined1 local_ce8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_cd8;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_cb8;
  RefVector local_c88;
  NoMeEdgeCalculator *local_c68;
  clock_t local_c60;
  map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *local_c58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c50;
  long local_c48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c30;
  undefined8 local_c28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c20;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_c10;
  anon_union_16_2_ba345be5_for_m_Storage local_be0;
  ulong local_bd0;
  anon_union_16_2_ba345be5_for_m_Storage local_bc8;
  ulong local_bb8;
  CliqueCollector local_bb0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_b90;
  string local_b60;
  string local_b40;
  string local_b20;
  string local_b00;
  string local_ae0;
  string local_ac0;
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_aa0;
  undefined1 local_a68 [8];
  size_type local_a60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a58 [14];
  ios_base local_970 [264];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_868;
  undefined8 local_858;
  size_type local_850;
  _Prime_rehash_policy local_848;
  undefined8 local_838;
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_830;
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_7f8;
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_7c0;
  undefined1 local_788 [8];
  pointer pbStack_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778 [7];
  ios_base aiStack_690 [264];
  undefined1 local_588 [8];
  pointer pbStack_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578 [14];
  ios_base aiStack_490 [264];
  undefined1 local_388 [8];
  char *local_380;
  _Alloc_hider local_378;
  long lStack_370;
  ios_base aiStack_290 [264];
  undefined2 local_188 [4];
  locale local_180 [336];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"in main",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  local_f00 = (undefined1  [8])&local_ef0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f00,
             "ChromaClique predicts nucleosome patterns NOMe-sequencing reads.\n\nUsage:\n  chromaclique [options] [--] <bamfile> [<output>]\nOptions:\n  -i NUM --iterations=NUM                  Number of iterations.\n                                           chromaclique will stop if the\n                                           superreads converge.\n                                           [default: -1]\n  -n --no_singletons                       Filter out single read cliques\n                                           after first iteration.\n  -L FILE --log=FILE                       Write log to <file>.\n  -bam --bam                               Option to create BAM File from output. <output> is used as prefix.\n  -nome --nome                             Option for NoMe Mode\n  -nP NUM --nomeParam=NUM                  Number of similar GC regions required for merging reads\n  -minOv NUM --minOverlap=NUM              minimum number of GC allowed in the overlapping regions\n  -R FILE --ref=FILE                       Reference File\n  -R FILE --FS=FILE                        Switch rates for the Forward strand\n  -R FILE --RS=FILE                        Switch rates for the Reverse strand\n  -unique NUM --uniqueSupportFilter=NUM    Filtering based on the specified number of unique support for each clique\n  -analysisFiles --analysisFiles           Option For creating analysis Files\n\n\n"
             ,"");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_588,argv + 1
             ,argv + argc,(allocator_type *)local_788);
  local_a60 = 0;
  local_a58[0]._M_local_buf[0] = '\0';
  local_a68 = (undefined1  [8])local_a58;
  docopt::docopt((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                  *)&local_ff8,(string *)local_f00,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_588,false,(string *)local_a68,false);
  if (local_a68 != (undefined1  [8])local_a58) {
    operator_delete((void *)local_a68);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_588);
  if (local_f00 != (undefined1  [8])&local_ef0) {
    operator_delete((void *)local_f00);
  }
  for (p_Var20 = local_ff8._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var20 != &local_ff8._M_impl.super__Rb_tree_header;
      p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20)) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>
            *)local_f00,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>
            *)(p_Var20 + 1));
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_f00,local_ef8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
    poVar19 = docopt::operator<<(poVar19,(value *)local_ee0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
    if (local_ee0._0_4_ == StringList) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_ed8);
    }
    else if ((local_ee0._0_4_ == String) &&
            ((pointer)local_ed8._0_8_ != (pointer)(local_ed8 + 0x10))) {
      operator_delete((void *)local_ed8._0_8_);
    }
    if (local_f00 != (undefined1  [8])&local_ef0) {
      operator_delete((void *)local_f00);
    }
  }
  local_f00 = (undefined1  [8])&local_ef0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"<bamfile>","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                          *)&local_ff8,(key_type *)local_f00);
  docopt::value::throwIfNotKind(pmVar21,String);
  local_10a0 = local_1090;
  pbVar6 = (pmVar21->variant).strList.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_10a0,pbVar6,
             (long)&(((pmVar21->variant).strList.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p + (long)pbVar6)
  ;
  if (local_f00 != (undefined1  [8])&local_ef0) {
    operator_delete((void *)local_f00);
  }
  local_1100 = local_10f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1100,"chromatypes.fasta","");
  local_f00 = (undefined1  [8])&local_ef0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"<output>","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                          *)&local_ff8,(key_type *)local_f00);
  KVar5 = pmVar21->kind;
  if (local_f00 != (undefined1  [8])&local_ef0) {
    operator_delete((void *)local_f00);
  }
  if (KVar5 != Empty) {
    local_f00 = (undefined1  [8])&local_ef0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"<output>","");
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                            *)&local_ff8,(key_type *)local_f00);
    docopt::value::throwIfNotKind(pmVar21,String);
    std::__cxx11::string::_M_assign((string *)&local_1100);
    if (local_f00 != (undefined1  [8])&local_ef0) {
      operator_delete((void *)local_f00);
    }
  }
  local_10c0 = local_10b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_10c0,"");
  local_f00 = (undefined1  [8])&local_ef0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"--allel_frequencies","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                          *)&local_ff8,(key_type *)local_f00);
  KVar5 = pmVar21->kind;
  if (local_f00 != (undefined1  [8])&local_ef0) {
    operator_delete((void *)local_f00);
  }
  if (KVar5 != Empty) {
    local_f00 = (undefined1  [8])&local_ef0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"--allel_frequencies","");
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                            *)&local_ff8,(key_type *)local_f00);
    docopt::value::throwIfNotKind(pmVar21,String);
    std::__cxx11::string::_M_assign((string *)&local_10c0);
    if (local_f00 != (undefined1  [8])&local_ef0) {
      operator_delete((void *)local_f00);
    }
  }
  local_10e0._M_dataplus._M_p = (pointer)&local_10e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_10e0,"");
  local_f00 = (undefined1  [8])&local_ef0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"--mean_and_sd_filename","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                          *)&local_ff8,(key_type *)local_f00);
  KVar5 = pmVar21->kind;
  if (local_f00 != (undefined1  [8])&local_ef0) {
    operator_delete((void *)local_f00);
  }
  if (KVar5 != Empty) {
    local_f00 = (undefined1  [8])&local_ef0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"--mean_and_sd_filename","")
    ;
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                            *)&local_ff8,(key_type *)local_f00);
    docopt::value::throwIfNotKind(pmVar21,String);
    std::__cxx11::string::_M_assign((string *)&local_10e0);
    if (local_f00 != (undefined1  [8])&local_ef0) {
      operator_delete((void *)local_f00);
    }
  }
  local_c30 = &local_c20;
  local_c28 = 0;
  local_c20._M_local_buf[0] = '\0';
  local_f58 = local_f48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f58,"");
  local_f00 = (undefined1  [8])&local_ef0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"--call_indels","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                          *)&local_ff8,(key_type *)local_f00);
  KVar5 = pmVar21->kind;
  if (local_f00 != (undefined1  [8])&local_ef0) {
    operator_delete((void *)local_f00);
  }
  if (KVar5 != Empty) {
    local_f00 = (undefined1  [8])&local_ef0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"--call_indels","");
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                            *)&local_ff8,(key_type *)local_f00);
    docopt::value::throwIfNotKind(pmVar21,String);
    std::__cxx11::string::_M_assign((string *)&local_f58);
    if (local_f00 != (undefined1  [8])&local_ef0) {
      operator_delete((void *)local_f00);
    }
  }
  local_f00 = (undefined1  [8])&local_ef0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"--iterations","");
  pmVar21 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                          *)&local_ff8,(key_type *)local_f00);
  docopt::value::throwIfNotKind(pmVar21,String);
  paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pmVar21->variant).strList.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  piVar22 = __errno_location();
  iVar17 = *piVar22;
  *piVar22 = 0;
  pppAVar23 = (_Map_pointer)strtol(paVar36->_M_local_buf,(char **)local_a68,10);
  if (local_a68 == (undefined1  [8])paVar36) {
    std::__throw_invalid_argument("stoi");
LAB_00145ba0:
    std::__throw_out_of_range("stoi");
LAB_00145bac:
    std::__throw_invalid_argument("stod");
LAB_00145bb8:
    std::__throw_invalid_argument("stod");
LAB_00145bc4:
    std::__throw_invalid_argument("stod");
  }
  else {
    if (((_Map_pointer)(long)(int)pppAVar23 != pppAVar23) || (*piVar22 == 0x22)) goto LAB_00145ba0;
    if (*piVar22 == 0) {
      *piVar22 = iVar17;
    }
    if (local_f00 != (undefined1  [8])&local_ef0) {
      operator_delete((void *)local_f00);
    }
    local_f00 = (undefined1  [8])&local_ef0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"--no_singletons","");
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                            *)&local_ff8,(key_type *)local_f00);
    docopt::value::throwIfNotKind(pmVar21,Bool);
    local_1071 = (pmVar21->variant).boolValue;
    if (local_f00 != (undefined1  [8])&local_ef0) {
      operator_delete((void *)local_f00);
    }
    local_cf8 = local_ce8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_cf8,"");
    local_f00 = (undefined1  [8])&local_ef0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"--log","");
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                            *)&local_ff8,(key_type *)local_f00);
    KVar5 = pmVar21->kind;
    if (local_f00 != (undefined1  [8])&local_ef0) {
      operator_delete((void *)local_f00);
    }
    if (KVar5 != Empty) {
      local_f00 = (undefined1  [8])&local_ef0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"--log","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                              *)&local_ff8,(key_type *)local_f00);
      docopt::value::throwIfNotKind(pmVar21,String);
      std::__cxx11::string::_M_assign((string *)&local_cf8);
      if (local_f00 != (undefined1  [8])&local_ef0) {
        operator_delete((void *)local_f00);
      }
    }
    local_f00 = (undefined1  [8])&local_ef0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"--doc_haplotypes","");
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                            *)&local_ff8,(key_type *)local_f00);
    KVar5 = pmVar21->kind;
    if (local_f00 != (undefined1  [8])&local_ef0) {
      operator_delete((void *)local_f00);
    }
    local_1040 = pppAVar23;
    if (KVar5 == Empty) {
      local_f08 = 0;
LAB_00143364:
      local_f00 = (undefined1  [8])&local_ef0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"--bam","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                              *)&local_ff8,(key_type *)local_f00);
      docopt::value::throwIfNotKind(pmVar21,Bool);
      local_1072 = (pmVar21->variant).boolValue;
      if (local_f00 != (undefined1  [8])&local_ef0) {
        operator_delete((void *)local_f00);
      }
      local_f00 = (undefined1  [8])&local_ef0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"--analysisFiles","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                              *)&local_ff8,(key_type *)local_f00);
      docopt::value::throwIfNotKind(pmVar21,Bool);
      bVar3 = (pmVar21->variant).boolValue;
      if (local_f00 != (undefined1  [8])&local_ef0) {
        operator_delete((void *)local_f00);
      }
      local_f00 = (undefined1  [8])&local_ef0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"--nome","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                              *)&local_ff8,(key_type *)local_f00);
      docopt::value::throwIfNotKind(pmVar21,Bool);
      local_1080 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)CONCAT71(local_1080._1_7_,(pmVar21->variant).boolValue);
      if (local_f00 != (undefined1  [8])&local_ef0) {
        operator_delete((void *)local_f00);
      }
      local_f00 = (undefined1  [8])&local_ef0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"--nomeParam","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                              *)&local_ff8,(key_type *)local_f00);
      docopt::value::throwIfNotKind(pmVar21,String);
      paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pmVar21->variant).strList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      iVar17 = *piVar22;
      *piVar22 = 0;
      pLVar30 = (LogWriter *)strtod(paVar36->_M_local_buf,(char **)local_a68);
      if (local_a68 == (undefined1  [8])paVar36) goto LAB_00145bac;
      local_1068 = pLVar30;
      if (*piVar22 == 0) {
LAB_0014350c:
        *piVar22 = iVar17;
      }
      else if (*piVar22 == 0x22) {
        std::__throw_out_of_range("stod");
        goto LAB_0014350c;
      }
      if (local_f00 != (undefined1  [8])&local_ef0) {
        operator_delete((void *)local_f00);
      }
      local_f00 = (undefined1  [8])&local_ef0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f00,"--uniqueSupportFilter","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                              *)&local_ff8,(key_type *)local_f00);
      docopt::value::throwIfNotKind(pmVar21,String);
      paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pmVar21->variant).strList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      iVar17 = *piVar22;
      *piVar22 = 0;
      local_f98 = strtod(paVar36->_M_local_buf,(char **)local_a68);
      if (local_a68 == (undefined1  [8])paVar36) goto LAB_00145bb8;
      if (*piVar22 == 0) {
LAB_001435af:
        *piVar22 = iVar17;
      }
      else if (*piVar22 == 0x22) {
        std::__throw_out_of_range("stod");
        goto LAB_001435af;
      }
      if (local_f00 != (undefined1  [8])&local_ef0) {
        operator_delete((void *)local_f00);
      }
      local_f00 = (undefined1  [8])&local_ef0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"--minOverlap","");
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                              *)&local_ff8,(key_type *)local_f00);
      docopt::value::throwIfNotKind(pmVar21,String);
      paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pmVar21->variant).strList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      iVar17 = *piVar22;
      *piVar22 = 0;
      local_1070 = (pointer)strtod(paVar36->_M_local_buf,(char **)local_a68);
      if (local_a68 != (undefined1  [8])paVar36) {
        if (*piVar22 == 0) {
LAB_00143652:
          *piVar22 = iVar17;
        }
        else if (*piVar22 == 0x22) {
          std::__throw_out_of_range("stod");
          goto LAB_00143652;
        }
        if (local_f00 != (undefined1  [8])&local_ef0) {
          operator_delete((void *)local_f00);
        }
        local_c50 = &local_c40;
        local_c48 = 0;
        local_c40._M_local_buf[0] = '\0';
        local_f00 = (undefined1  [8])&local_ef0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"--ref","");
        pmVar21 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                                *)&local_ff8,(key_type *)local_f00);
        KVar5 = pmVar21->kind;
        if (local_f00 != (undefined1  [8])&local_ef0) {
          operator_delete((void *)local_f00);
        }
        if (KVar5 != Empty) {
          local_f00 = (undefined1  [8])&local_ef0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"--ref","");
          pmVar21 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                                  *)&local_ff8,(key_type *)local_f00);
          docopt::value::throwIfNotKind(pmVar21,String);
          std::__cxx11::string::_M_assign((string *)&local_c50);
          if (local_f00 != (undefined1  [8])&local_ef0) {
            operator_delete((void *)local_f00);
          }
        }
        local_f00 = (undefined1  [8])&local_ef0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"--FS","");
        pmVar21 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                                *)&local_ff8,(key_type *)local_f00);
        docopt::value::throwIfNotKind(pmVar21,String);
        pbVar6 = (pmVar21->variant).strList.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_ac0._M_dataplus._M_p = (pointer)&local_ac0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_ac0,pbVar6,
                   (long)&(((pmVar21->variant).strList.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p +
                   (long)pbVar6);
        readSwitchRateFile((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                            *)&local_7c0,&local_ac0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ac0._M_dataplus._M_p != &local_ac0.field_2) {
          operator_delete(local_ac0._M_dataplus._M_p);
        }
        if (local_f00 != (undefined1  [8])&local_ef0) {
          operator_delete((void *)local_f00);
        }
        local_f00 = (undefined1  [8])&local_ef0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"--RS","");
        pmVar21 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                                *)&local_ff8,(key_type *)local_f00);
        docopt::value::throwIfNotKind(pmVar21,String);
        pbVar6 = (pmVar21->variant).strList.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_ae0._M_dataplus._M_p = (pointer)&local_ae0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_ae0,pbVar6,
                   (long)&(((pmVar21->variant).strList.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p +
                   (long)pbVar6);
        readSwitchRateFile((unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                            *)&local_7f8,&local_ae0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ae0._M_dataplus._M_p != &local_ae0.field_2) {
          operator_delete(local_ae0._M_dataplus._M_p);
        }
        if (local_f00 != (undefined1  [8])&local_ef0) {
          operator_delete((void *)local_f00);
        }
        if ((local_f50 !=
             (map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              *)0x0) && (local_10e0._M_string_length == 0)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "Error: when using option -I, option -M must also be given.",0x3a);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
          std::ostream::put(-0x80);
          uVar18 = 1;
          std::ostream::flush();
          goto LAB_00145a9e;
        }
        local_aa0._M_buckets = &local_aa0._M_single_bucket;
        local_aa0._M_bucket_count = 1;
        local_aa0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_aa0._M_element_count = 0;
        local_aa0._M_rehash_policy._M_max_load_factor = 1.0;
        local_aa0._M_rehash_policy._M_next_resize = 0;
        local_aa0._M_single_bucket = (__node_base_ptr)0x0;
        std::ostream::flush();
        local_1000 = local_f50;
        if (local_10b8 == 0) {
          uVar18 = 0;
          pmVar51 = local_f50;
        }
        else {
          std::ifstream::ifstream((istream *)local_f00,local_10c0,_S_in);
          local_a68 = (undefined1  [8])local_a58;
          local_a60 = 0;
          local_a58[0]._M_local_buf[0] = '\0';
          uVar18 = 0;
          this = (locale *)(local_788 + 8);
          while( true ) {
            cVar15 = std::ios::widen((char)*(undefined8 *)((long)local_f00 + -0x18));
            piVar25 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)local_f00,(string *)local_a68,cVar15);
            if (((byte)piVar25[*(long *)(*(long *)piVar25 + -0x18) + 0x20] & 5) != 0) break;
            local_588 = (undefined1  [8])0x0;
            pbStack_580 = (pointer)0x0;
            local_578[0]._M_allocated_capacity = (pointer)0x0;
            std::locale::locale((locale *)&local_b90);
            local_188[0] = 0x2000;
            std::locale::locale(local_180,(locale *)&local_b90);
            sVar37 = local_a60;
            auVar55 = local_a68;
            local_388._0_2_ = local_188[0];
            std::locale::locale((locale *)(local_388 + 8),local_180);
            local_788._0_2_ = local_388._0_2_;
            std::locale::locale(this,(locale *)(local_388 + 8));
            do {
              sVar57 = sVar37;
              if (sVar57 == 0) goto LAB_00143a68;
              _Var4 = *(_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)((long)auVar55 + (sVar57 - 1));
              pcVar26 = std::use_facet<std::ctype<char>>(this);
              sVar37 = sVar57 - 1;
            } while ((local_788._0_2_ &
                     *(ushort *)(*(long *)(pcVar26 + 0x30) + (ulong)(byte)_Var4 * 2)) != 0);
            auVar55 = (undefined1  [8])((long)auVar55 + sVar57);
LAB_00143a68:
            std::locale::~locale(this);
            local_a60 = (long)auVar55 - (long)local_a68;
            *(_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)auVar55 = (_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                           )0x0;
            std::locale::~locale((locale *)(local_388 + 8));
            std::locale::~locale(local_180);
            std::locale::~locale((locale *)&local_b90);
            local_788 = (undefined1  [8])0x199618;
            pbStack_780 = (pointer)0x199619;
            boost::algorithm::detail::is_any_ofF<char>::
            is_any_ofF<boost::iterator_range<char_const*>>
                      ((is_any_ofF<char> *)&local_bc8,(iterator_range<const_char_*> *)local_788);
            boost::algorithm::
            split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_588,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a68,(is_any_ofF<char> *)&local_bc8,token_compress_on);
            if ((0x10 < local_bb8) && (local_bc8.m_dynSet != (set_value_type *)0x0)) {
              operator_delete__(local_bc8.m_dynSet);
            }
            auVar55 = local_588;
            local_788 = (undefined1  [8])0x0;
            pbStack_780 = (pointer)0x0;
            local_778[0]._M_dataplus._M_p = (pointer)0x0;
            local_388 = (undefined1  [8])0x199798;
            local_380 = "";
            boost::algorithm::detail::is_any_ofF<char>::
            is_any_ofF<boost::iterator_range<char_const*>>
                      ((is_any_ofF<char> *)&local_be0,(iterator_range<const_char_*> *)local_388);
            boost::algorithm::
            split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_788,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar55,
                       (is_any_ofF<char> *)&local_be0,token_compress_on);
            if ((0x10 < local_bd0) && (local_be0.m_dynSet != (set_value_type *)0x0)) {
              operator_delete__(local_be0.m_dynSet);
            }
            auVar55 = local_588;
            if ((ulong)((long)pbStack_780 - (long)local_788) < 0x21) {
              dVar9 = atof((((pointer)((long)local_588 + 0x20))->_M_dataplus)._M_p);
              dVar10 = atof((((pointer)((long)auVar55 + 0x40))->_M_dataplus)._M_p);
              auVar55 = local_588;
              dVar11 = atof((((pointer)((long)local_588 + 0x60))->_M_dataplus)._M_p);
              dVar12 = atof((((pointer)((long)auVar55 + 0x80))->_M_dataplus)._M_p);
              dVar9 = log10(dVar12 * dVar12 + dVar11 * dVar11 + dVar10 * dVar10 + dVar9 * dVar9);
              iVar17 = atoi(*(char **)local_588);
              local_388._0_4_ = iVar17;
              pmVar27 = std::__detail::
                        _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&local_aa0,(key_type *)local_388);
              *pmVar27 = dVar9;
              uVar18 = atoi(*(char **)local_588);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_788);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_588);
          }
          std::ifstream::close();
          pmVar51 = local_1000;
          if (local_a68 != (undefined1  [8])local_a58) {
            operator_delete((void *)local_a68);
          }
          std::ifstream::~ifstream(local_f00);
        }
        cVar28 = clock();
        local_cd8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_cd8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_cd8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_f00 = (undefined1  [8])&local_ef0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"");
        BamTools::SamHeader::SamHeader((SamHeader *)local_188,(string *)local_f00);
        if (local_f00 != (undefined1  [8])&local_ef0) {
          operator_delete((void *)local_f00);
        }
        local_c88.super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_c88.super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c88.super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_c60 = cVar28;
        local_b00._M_dataplus._M_p = (pointer)&local_b00.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b00,local_10a0,local_10a0 + local_1098);
        local_b20._M_dataplus._M_p = (pointer)&local_b20.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b20,local_c50,local_c50->_M_local_buf + local_c48);
        this_01 = &readBamFile(&local_b00,&local_cd8,&local_100c,(SamHeader *)local_188,&local_c88,
                               &local_b20)->
                   super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b20._M_dataplus._M_p != &local_b20.field_2) {
          operator_delete(local_b20._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b00._M_dataplus._M_p != &local_b00.field_2) {
          operator_delete(local_b00._M_dataplus._M_p);
        }
        if (uVar18 < local_100c) {
          uVar18 = local_100c;
        }
        local_f90 = (vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_> *)0x0;
        local_100c = uVar18;
        if ((char)local_1080 == '\0') {
          pNVar29 = (NoMeEdgeCalculator *)operator_new(0x70);
          NewEdgeCalculator::NewEdgeCalculator
                    ((NewEdgeCalculator *)pNVar29,0.9,0.99,0.9,false,
                     (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                      *)&local_aa0,0.95,0.6,0.97,uVar18,false);
        }
        else {
          pNVar29 = (NoMeEdgeCalculator *)operator_new(0x80);
          local_f00 = (undefined1  [8])&local_830;
          local_830._M_buckets = (__buckets_ptr)0x0;
          local_830._M_bucket_count = local_7c0._M_bucket_count;
          local_830._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_830._M_element_count = local_7c0._M_element_count;
          local_830._M_rehash_policy._M_max_load_factor =
               local_7c0._M_rehash_policy._M_max_load_factor;
          local_830._M_rehash_policy._4_4_ = local_7c0._M_rehash_policy._4_4_;
          local_830._M_rehash_policy._M_next_resize = local_7c0._M_rehash_policy._M_next_resize;
          local_830._M_single_bucket = (__node_base_ptr)0x0;
          std::
          _Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_assign<std::_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<int_const,double>,false>>>>
                    ((_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)local_f00,&local_7c0,
                     (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_int,_double>,_false>_>_>
                      *)local_f00);
          local_f00 = (undefined1  [8])&local_868;
          local_868._M_allocated_capacity = 0;
          local_868._8_8_ = local_7f8._M_bucket_count;
          local_858 = 0;
          local_850 = local_7f8._M_element_count;
          local_848._M_max_load_factor = local_7f8._M_rehash_policy._M_max_load_factor;
          local_848._4_4_ = local_7f8._M_rehash_policy._4_4_;
          local_848._M_next_resize = local_7f8._M_rehash_policy._M_next_resize;
          local_838 = 0;
          std::
          _Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_assign<std::_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<int_const,double>,false>>>>
                    ((_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)local_f00,&local_7f8,
                     (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_int,_double>,_false>_>_>
                      *)local_f00);
          NoMeEdgeCalculator::NoMeEdgeCalculator
                    (pNVar29,(double)local_1068,
                     (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                      *)&local_830,
                     (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                      *)&local_868);
          std::
          _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)&local_868);
          std::
          _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&local_830);
        }
        if (pmVar51 ==
            (map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             *)0x0) {
          this_02 = (GaussianEdgeCalculator *)0x0;
LAB_001440f9:
          if (local_1000 ==
              (map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
               *)0x0) {
            local_1008 = (long *)0x0;
          }
          else {
            local_1008 = (long *)operator_new(0x200);
            std::ofstream::ofstream(local_1008,local_f58,_S_out);
          }
          iVar17 = std::__cxx11::string::compare((char *)&local_cf8);
          if (iVar17 == 0) {
            pLVar30 = (LogWriter *)0x0;
          }
          else {
            pLVar30 = (LogWriter *)operator_new(0x290);
            local_b40._M_dataplus._M_p = (pointer)&local_b40.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b40,local_cf8,local_cf8 + local_cf0);
            LogWriter::LogWriter(pLVar30,&local_b40);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b40._M_dataplus._M_p != &local_b40.field_2) {
              operator_delete(local_b40._M_dataplus._M_p);
            }
          }
          local_1068 = pLVar30;
          CliqueCollector::CliqueCollector(&local_bb0,pLVar30);
          this_03 = (CLEVER *)operator_new(0x90);
          CLEVER::CLEVER(this_03,&pNVar29->super_EdgeCalculator,&local_bb0,local_1068);
          if (this_02 != (GaussianEdgeCalculator *)0x0) {
            (*(this_03->super_CliqueFinder)._vptr_CliqueFinder[6])(this_03,this_02);
          }
          local_1010 = 0;
          local_1014 = 0;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"start: ",7);
          std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          uVar18 = (uint)(double)local_1070;
          local_b90._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_b90._M_impl.super__Rb_tree_header._M_header;
          local_b90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_b90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_b90._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_1000 = &local_1068->vertices_;
          local_c58 = &local_1068->cliques_;
          uVar56 = 0;
          local_1080 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x3ff0000000000000;
          local_c68 = pNVar29;
          local_b90._M_impl.super__Rb_tree_header._M_header._M_right =
               local_b90._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            if (uVar56 == (uint)local_1040) break;
            if (local_b90._M_impl.super__Rb_tree_header._M_node_count != 0) {
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::clear(&local_b90);
            }
            (*(this_03->super_CliqueFinder)._vptr_CliqueFinder[3])(this_03,&local_b90);
            if (local_1068 != (LogWriter *)0x0) {
              std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::clear(&local_1000->_M_t);
              std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::clear(&local_c58->_M_t);
            }
            ppAVar31 = (this_01->_M_impl).super__Deque_impl_data._M_start._M_cur;
            if ((this_01->_M_impl).super__Deque_impl_data._M_finish._M_cur != ppAVar31) {
              pppAVar23 = (this_01->_M_impl).super__Deque_impl_data._M_finish._M_node;
              bVar59 = uVar56 == 1 & local_1071;
              local_1080 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)((double)local_1080 * -3.0 +
                              1.0 / (double)(int)((int)((ulong)((long)(this_01->_M_impl).
                                                                      super__Deque_impl_data.
                                                                      _M_start._M_last -
                                                               (long)(this_01->_M_impl).
                                                                     super__Deque_impl_data._M_start
                                                                     ._M_cur) >> 3) +
                                                  (int)((ulong)((long)(this_01->_M_impl).
                                                                      super__Deque_impl_data.
                                                                      _M_finish._M_cur -
                                                               (long)(this_01->_M_impl).
                                                                     super__Deque_impl_data.
                                                                     _M_finish._M_first) >> 3) +
                                                 ((((uint)((int)pppAVar23 -
                                                          *(int *)&(this_01->_M_impl).
                                                                   super__Deque_impl_data._M_start.
                                                                   _M_node) >> 3) - 1) +
                                                 (uint)(pppAVar23 == (_Map_pointer)0x0)) * 0x40));
              do {
                local_f00 = (undefined1  [8])*ppAVar31;
                std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::pop_front
                          ((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)this_01);
                if (((bVar59 == 0) || ((*(uint *)((long)local_f00 + 0x1b0) & 0xfffffffe) != 0)) &&
                   (((int)uVar56 < 2 ||
                    (dVar9 = AlignmentRecord::getProbability((AlignmentRecord *)local_f00),
                    (double)local_1080 <= dVar9)))) {
                  (*(this_03->super_CliqueFinder)._vptr_CliqueFinder[2])
                            (this_03,local_f00,&local_1010,&local_1014,(ulong)uVar18,(ulong)uVar56);
                }
                auVar55 = local_f00;
                if (local_f00 != (undefined1  [8])0x0) {
                  AlignmentRecord::~AlignmentRecord((AlignmentRecord *)local_f00);
                  operator_delete((void *)auVar55);
                }
                ppAVar31 = (this_01->_M_impl).super__Deque_impl_data._M_start._M_cur;
              } while ((this_01->_M_impl).super__Deque_impl_data._M_finish._M_cur != ppAVar31);
            }
            local_1070 = (pointer)CONCAT71(local_1070._1_7_,2 < (int)uVar18);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tedges: ",8);
            std::ostream::operator<<((ostream *)&std::cout,local_1010);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\tnonEdges: ",0xb);
            plVar32 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_1014);
            std::ios::widen((char)*(undefined8 *)(*plVar32 + -0x18) + (char)plVar32);
            std::ostream::put((char)plVar32);
            std::ostream::flush();
            std::_Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::~_Deque_base
                      (this_01);
            operator_delete(this_01);
            (*(this_03->super_CliqueFinder)._vptr_CliqueFinder[4])();
            this_01 = &CliqueCollector::finish(&local_bb0)->
                       super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>;
            if (local_1068 != (LogWriter *)0x0) {
              LogWriter::finish(local_1068);
            }
            local_1080 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)setProbabilities((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>
                                              *)this_01);
            iVar17 = (*(this_03->super_CliqueFinder)._vptr_CliqueFinder[7])();
            if ((char)iVar17 == '\0') {
              poVar19 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar56);
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,": ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
              uVar56 = uVar56 + 1;
              local_1010 = 0;
              local_1014 = 0;
            }
            uVar18 = uVar18 - (byte)local_1070;
          } while ((char)iVar17 == '\0');
          local_a68 = (undefined1  [8])local_a58;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a68,local_1100,local_1100 + local_10f8);
          std::__cxx11::string::append(local_a68);
          std::ofstream::ofstream(local_f00,(string *)local_a68,_S_out);
          if (local_a68 != (undefined1  [8])local_a58) {
            operator_delete((void *)local_a68);
          }
          setProbabilities((deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)this_01);
          if (-1.0 < local_f98) {
            local_788 = (undefined1  [8])local_778;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_788,local_1100,local_1100 + local_10f8);
            std::__cxx11::string::append(local_788);
            plVar32 = (long *)std::__cxx11::string::append(local_788);
            paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar32 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar32 == paVar36) {
              local_578[0]._0_8_ = paVar36->_M_allocated_capacity;
              local_578[0]._8_8_ = plVar32[3];
              local_588 = (undefined1  [8])local_578;
            }
            else {
              local_578[0]._0_8_ = paVar36->_M_allocated_capacity;
              local_588 = (undefined1  [8])*plVar32;
            }
            pbStack_580 = (pointer)plVar32[1];
            *plVar32 = (long)paVar36;
            plVar32[1] = 0;
            *(undefined1 *)(plVar32 + 2) = 0;
            std::ofstream::ofstream(local_a68,(string *)local_588,_S_out);
            if (local_588 != (undefined1  [8])local_578) {
              operator_delete((void *)local_588);
            }
            if (local_788 != (undefined1  [8])local_778) {
              operator_delete((void *)local_788);
            }
            local_388 = (undefined1  [8])&local_378;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_388,local_1100,local_1100 + local_10f8);
            std::__cxx11::string::append(local_388);
            plVar32 = (long *)std::__cxx11::string::append(local_388);
            pbVar41 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (plVar32 + 2);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar32 ==
                pbVar41) {
              local_778[0]._M_dataplus._M_p = (pbVar41->_M_dataplus)._M_p;
              local_778[0]._M_string_length = plVar32[3];
              local_788 = (undefined1  [8])local_778;
            }
            else {
              local_778[0]._M_dataplus._M_p = (pbVar41->_M_dataplus)._M_p;
              local_788 = (undefined1  [8])*plVar32;
            }
            pbStack_780 = (pointer)plVar32[1];
            *plVar32 = (long)pbVar41;
            plVar32[1] = 0;
            *(undefined1 *)(plVar32 + 2) = 0;
            std::ofstream::ofstream(local_588,(string *)local_788,_S_out);
            if (local_788 != (undefined1  [8])local_778) {
              operator_delete((void *)local_788);
            }
            if (local_388 != (undefined1  [8])&local_378) {
              operator_delete((void *)local_388);
            }
            pp_Var13 = &local_f38._M_impl.super__Rb_tree_header._M_header._M_parent;
            local_f38._M_impl._0_8_ = pp_Var13;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f38,local_1100,local_1100 + local_10f8);
            std::__cxx11::string::append((char *)&local_f38);
            plVar32 = (long *)std::__cxx11::string::append((char *)&local_f38);
            p_Var42 = (_Alloc_hider *)(plVar32 + 2);
            if ((_Alloc_hider *)*plVar32 == p_Var42) {
              local_378._M_p = p_Var42->_M_p;
              lStack_370 = plVar32[3];
              local_388 = (undefined1  [8])&local_378;
            }
            else {
              local_378._M_p = p_Var42->_M_p;
              local_388 = (undefined1  [8])*plVar32;
            }
            local_380 = (char *)plVar32[1];
            *plVar32 = (long)p_Var42;
            plVar32[1] = 0;
            *(undefined1 *)(plVar32 + 2) = 0;
            std::ofstream::ofstream(local_788,(string *)local_388,_S_out);
            if (local_388 != (undefined1  [8])&local_378) {
              operator_delete((void *)local_388);
            }
            if ((_Base_ptr *)local_f38._M_impl._0_8_ != pp_Var13) {
              operator_delete((void *)local_f38._M_impl._0_8_);
            }
            pp_Var1 = &local_f88._M_impl.super__Rb_tree_header._M_header._M_parent;
            local_f88._M_impl._0_8_ = pp_Var1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f88,local_1100,local_1100 + local_10f8);
            std::__cxx11::string::append((char *)&local_f88);
            plVar32 = (long *)std::__cxx11::string::append((char *)&local_f88);
            plVar43 = plVar32 + 2;
            if ((_Base_ptr *)*plVar32 == (_Base_ptr *)plVar43) {
              local_f38._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar43;
              local_f38._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar32[3];
              local_f38._M_impl._0_8_ = pp_Var13;
            }
            else {
              local_f38._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar43;
              local_f38._M_impl._0_8_ = (_Base_ptr *)*plVar32;
            }
            local_f38._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar32[1];
            *plVar32 = (long)plVar43;
            plVar32[1] = 0;
            *(undefined1 *)(plVar32 + 2) = 0;
            std::ofstream::ofstream(local_388,(string *)&local_f38,_S_out);
            if ((_Base_ptr *)local_f38._M_impl._0_8_ != pp_Var13) {
              operator_delete((void *)local_f38._M_impl._0_8_);
            }
            if ((_Base_ptr *)local_f88._M_impl._0_8_ != pp_Var1) {
              operator_delete((void *)local_f88._M_impl._0_8_);
            }
            local_f38._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_f38._M_impl.super__Rb_tree_header._M_header;
            local_f38._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 local_f38._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
            local_f38._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_f38._M_impl.super__Rb_tree_header._M_node_count = 0;
            paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(this_01->_M_impl).super__Deque_impl_data._M_start._M_cur;
            local_f38._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_f38._M_impl.super__Rb_tree_header._M_header._M_left;
            if (paVar36 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(this_01->_M_impl).super__Deque_impl_data._M_finish._M_cur) {
              local_1070 = (pointer)(this_01->_M_impl).super__Deque_impl_data._M_start._M_last;
              local_1040 = (this_01->_M_impl).super__Deque_impl_data._M_start._M_node;
              do {
                local_1080 = paVar36;
                AlignmentRecord::getConsistingReads_abi_cxx11_
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_cb8,(AlignmentRecord *)paVar36->_M_allocated_capacity);
                pbVar6 = (pointer)CONCAT44(local_cb8._M_impl.super__Rb_tree_header._M_header._4_4_,
                                           local_cb8._M_impl.super__Rb_tree_header._M_header.
                                           _M_color);
                pbVar52 = (pointer)local_cb8._M_impl._0_8_;
                while( true ) {
                  if (pbVar52 == pbVar6) break;
                  _Var7._M_p = (pbVar52->_M_dataplus)._M_p;
                  local_f88._M_impl._0_8_ =
                       &local_f88._M_impl.super__Rb_tree_header._M_header._M_parent;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_f88,_Var7._M_p,_Var7._M_p + pbVar52->_M_string_length)
                  ;
                  lVar24 = std::__cxx11::string::find((char *)&local_f88,0x19981a,0);
                  if ((lVar24 == -1) &&
                     (lVar24 = std::__cxx11::string::find((char *)&local_f88,0x19981e,0),
                     lVar24 == -1)) {
                    local_fc8 = (undefined1  [8])(local_fc0 + 8);
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_fc8,local_f88._M_impl._0_8_,
                               (undefined1 *)
                               (local_f88._M_impl._0_8_ +
                               CONCAT44(local_f88._M_impl.super__Rb_tree_header._M_header._4_4_,
                                        local_f88._M_impl.super__Rb_tree_header._M_header._M_color))
                              );
                    auVar55 = local_fc8;
                    _Var33 = std::
                             __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<std::unary_negate<std::pointer_to_unary_function<int,int>>>>
                                       (local_fc8,(pointer)(local_fc0._0_8_ + (long)local_fc8),
                                        isspace);
                    pcVar53 = (pointer)((long)auVar55 + -(long)local_fc8);
                    if ((char *)(local_fc0._0_8_ + (long)local_fc8) == _Var33._M_current) {
                      *(char *)((long)local_fc8 + (long)pcVar53) = '\0';
                      local_fc0._0_8_ = pcVar53;
                    }
                    else {
                      std::__cxx11::string::_M_erase((ulong)local_fc8,(ulong)pcVar53);
                    }
                    local_c10._M_impl._0_8_ = local_fc0._0_8_ + (long)local_fc8;
                    local_1060._M_dataplus._M_p = (pointer)local_fc8;
                    std::
                    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<std::unary_negate<std::pointer_to_unary_function<int,int>>>>
                              (local_1038,&local_c10,&local_1060,isspace);
                    local_fc0._0_8_ = local_1038._0_8_ - (long)local_fc8;
                    *(_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)local_1038._0_8_ =
                         (_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          )0x0;
                    iVar34 = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             ::find(&local_f38,(key_type *)local_fc8);
                    if ((_Rb_tree_header *)iVar34._M_node ==
                        &local_f38._M_impl.super__Rb_tree_header) {
                      pmVar35 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                              *)&local_f38,(key_type *)local_fc8);
                      *pmVar35 = 1;
                    }
                    else {
                      pmVar35 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                              *)&local_f38,(key_type *)local_fc8);
                      iVar17 = *pmVar35;
                      pmVar35 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                              *)&local_f38,(key_type *)local_fc8);
                      *pmVar35 = iVar17 + 1;
                    }
                    if (local_fc8 != (undefined1  [8])(local_fc0 + 8)) {
                      operator_delete((void *)local_fc8);
                    }
                  }
                  if ((_Base_ptr *)local_f88._M_impl._0_8_ !=
                      &local_f88._M_impl.super__Rb_tree_header._M_header._M_parent) {
                    operator_delete((void *)local_f88._M_impl._0_8_);
                  }
                  pbVar52 = pbVar52 + 1;
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_cb8);
                paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)local_1080 + 8);
                if (paVar36 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1070) {
                  paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1040[1];
                  local_1040 = local_1040 + 1;
                  local_1070 = (pointer)(paVar36->_M_local_buf + 0x200);
                }
              } while (paVar36 !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(this_01->_M_impl).super__Deque_impl_data._M_finish._M_cur);
            }
            local_f88._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_f88._M_impl.super__Rb_tree_header._M_header;
            local_f88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_f88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_f88._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_fc0._16_8_ = local_fc0;
            local_fc0._0_8_ = local_fc0._0_8_ & 0xffffffff00000000;
            local_fc0._8_8_ = (undefined1 *)0x0;
            local_fa0 = 0;
            local_cb8._M_impl.super__Rb_tree_header._M_header._M_left =
                 (_Base_ptr)((long)&local_cb8 + 8);
            local_cb8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_cb8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_cb8._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_c10._M_impl.super__Rb_tree_header._M_header._M_left =
                 (_Base_ptr)((long)&local_c10 + 8);
            local_c10._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_c10._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_c10._M_impl.super__Rb_tree_header._M_node_count = 0;
            paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(this_01->_M_impl).super__Deque_impl_data._M_start._M_cur;
            local_fa8 = (_Base_ptr)local_fc0._16_8_;
            local_f88._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_f88._M_impl.super__Rb_tree_header._M_header._M_left;
            local_cb8._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_cb8._M_impl.super__Rb_tree_header._M_header._M_left;
            local_c10._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_c10._M_impl.super__Rb_tree_header._M_header._M_left;
            if (paVar36 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(this_01->_M_impl).super__Deque_impl_data._M_finish._M_cur) {
              local_1070 = (pointer)(this_01->_M_impl).super__Deque_impl_data._M_start._M_last;
              local_1040 = (this_01->_M_impl).super__Deque_impl_data._M_start._M_node;
              do {
                local_1080 = paVar36;
                AlignmentRecord::getConsistingReads_abi_cxx11_
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1038,(AlignmentRecord *)paVar36->_M_allocated_capacity);
                uVar40 = local_1038._8_8_;
                if (local_1038._0_8_ == local_1038._8_8_) {
LAB_00144f2c:
                  paVar36 = local_1080;
                  iVar17 = *(int *)(local_1080->_M_allocated_capacity + 0x314);
                  puVar44 = local_fc0;
                  for (puVar49 = (undefined1 *)local_fc0._8_8_; puVar49 != (undefined1 *)0x0;
                      puVar49 = *(undefined1 **)
                                 (puVar49 + ((ulong)(*(int *)(puVar49 + 0x20) < iVar17) + 2) * 8)) {
                    if (iVar17 <= *(int *)(puVar49 + 0x20)) {
                      puVar44 = puVar49;
                    }
                  }
                  p_Var2 = &local_f88._M_impl.super__Rb_tree_header;
                  puVar49 = local_fc0;
                  if ((puVar44 != local_fc0) &&
                     (puVar49 = puVar44, iVar17 < *(int *)(puVar44 + 0x20))) {
                    puVar49 = local_fc0;
                  }
                  pkVar54 = (key_type *)(local_1080->_M_allocated_capacity + 0x314);
                  if (puVar49 == local_fc0) {
                    pmVar35 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)local_fc8,pkVar54);
                    *pmVar35 = 1;
                  }
                  else {
                    pmVar35 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)local_fc8,pkVar54);
                    iVar17 = *pmVar35;
                    pmVar35 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)local_fc8,
                                           (key_type *)(paVar36->_M_allocated_capacity + 0x314));
                    *pmVar35 = iVar17 + 1;
                  }
                  plVar32 = (long *)std::ostream::operator<<
                                              ((ostream *)local_588,
                                               *(int *)(paVar36->_M_allocated_capacity + 0x314));
                  std::ios::widen((char)*(undefined8 *)(*plVar32 + -0x18) + (char)plVar32);
                  std::ostream::put((char)plVar32);
                  std::ostream::flush();
                  pkVar54 = (key_type *)(paVar36->_M_allocated_capacity + 0x310);
                  p_Var38 = &p_Var2->_M_header;
                  if (local_f88._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0)
                  {
                    p_Var39 = local_f88._M_impl.super__Rb_tree_header._M_header._M_parent;
                    do {
                      if (*pkVar54 <= (int)*(size_t *)(p_Var39 + 1)) {
                        p_Var38 = p_Var39;
                      }
                      p_Var39 = (&p_Var39->_M_left)[(int)*(size_t *)(p_Var39 + 1) < *pkVar54];
                    } while (p_Var39 != (_Base_ptr)0x0);
                  }
                  p_Var45 = p_Var2;
                  if (((_Rb_tree_header *)p_Var38 != p_Var2) &&
                     (p_Var45 = (_Rb_tree_header *)p_Var38,
                     *pkVar54 < (int)((_Rb_tree_header *)p_Var38)->_M_node_count)) {
                    p_Var45 = p_Var2;
                  }
                  if (p_Var45 == p_Var2) {
                    pmVar35 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)&local_f88,pkVar54);
                    *pmVar35 = 1;
                  }
                  else {
                    pmVar35 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)&local_f88,pkVar54);
                    iVar17 = *pmVar35;
                    pmVar35 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)&local_f88,
                                           (key_type *)(paVar36->_M_allocated_capacity + 0x310));
                    *pmVar35 = iVar17 + 1;
                  }
                  plVar32 = (long *)std::ostream::operator<<
                                              ((ostream *)local_388,
                                               *(int *)(paVar36->_M_allocated_capacity + 0x310));
                  std::ios::widen((char)*(undefined8 *)(*plVar32 + -0x18) + (char)plVar32);
                }
                else {
                  iVar60 = 0;
                  iVar17 = 0;
                  paVar58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1038._0_8_;
                  do {
                    local_1060._M_dataplus._M_p = (pointer)&local_1060.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_1060,paVar58->_M_allocated_capacity,
                               *(long *)((long)paVar58 + 8) + paVar58->_M_allocated_capacity);
                    lVar24 = std::__cxx11::string::find((char *)&local_1060,0x19981a,0);
                    if ((lVar24 == -1) &&
                       (lVar24 = std::__cxx11::string::find((char *)&local_1060,0x19981e,0),
                       lVar24 == -1)) {
                      pmVar35 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                              *)&local_f38,&local_1060);
                      if (*pmVar35 < 2) {
                        pmVar35 = std::
                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                                *)&local_f38,&local_1060);
                        if (*pmVar35 == 1) {
                          sVar37 = local_1080->_M_allocated_capacity;
                          *(int *)(sVar37 + 0x314) = *(int *)(sVar37 + 0x314) + 1;
                          goto LAB_00144e0c;
                        }
                      }
                      else {
                        sVar37 = local_1080->_M_allocated_capacity;
LAB_00144e0c:
                        *(int *)(sVar37 + 0x310) = *(int *)(sVar37 + 0x310) + 1;
                      }
                      lVar24 = std::__cxx11::string::find((char *)&local_1060,0x199825,0);
                      iVar17 = iVar17 + (uint)(lVar24 != -1);
                      lVar24 = std::__cxx11::string::find((char *)&local_1060,0x19982d,0);
                      iVar60 = iVar60 + (uint)(lVar24 != -1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1060._M_dataplus._M_p != &local_1060.field_2) {
                      operator_delete(local_1060._M_dataplus._M_p);
                    }
                    paVar36 = local_1080;
                    paVar58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(paVar58->_M_local_buf + 0x20);
                  } while (paVar58 !=
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)uVar40);
                  if ((iVar17 == 0) || (iVar60 == 0)) goto LAB_00144f2c;
                  iVar17 = *(int *)(local_1080->_M_allocated_capacity + 0x314);
                  p_Var46 = (_Base_ptr)((long)&local_c10 + 8);
                  p_Var39 = p_Var46;
                  for (p_Var38 = local_c10._M_impl.super__Rb_tree_header._M_header._M_parent;
                      p_Var38 != (_Base_ptr)0x0;
                      p_Var38 = (&p_Var38->_M_left)[(int)p_Var38[1]._M_color < iVar17]) {
                    if (iVar17 <= (int)p_Var38[1]._M_color) {
                      p_Var39 = p_Var38;
                    }
                  }
                  p_Var38 = (_Base_ptr)((long)&local_cb8 + 8);
                  p_Var48 = p_Var46;
                  if ((p_Var39 != p_Var46) && (p_Var48 = p_Var39, iVar17 < (int)p_Var39[1]._M_color)
                     ) {
                    p_Var48 = p_Var46;
                  }
                  pkVar54 = (key_type *)(local_1080->_M_allocated_capacity + 0x314);
                  if (p_Var48 == p_Var46) {
                    pmVar35 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)&local_c10,pkVar54);
                    *pmVar35 = 1;
                  }
                  else {
                    pmVar35 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)&local_c10,pkVar54);
                    iVar17 = *pmVar35;
                    pmVar35 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)&local_c10,
                                           (key_type *)(paVar36->_M_allocated_capacity + 0x314));
                    *pmVar35 = iVar17 + 1;
                  }
                  plVar32 = (long *)std::ostream::operator<<
                                              ((ostream *)local_a68,
                                               *(int *)(paVar36->_M_allocated_capacity + 0x314));
                  std::ios::widen((char)*(undefined8 *)(*plVar32 + -0x18) + (char)plVar32);
                  std::ostream::put((char)plVar32);
                  std::ostream::flush();
                  pkVar54 = (key_type *)(paVar36->_M_allocated_capacity + 0x310);
                  p_Var39 = p_Var38;
                  if (local_cb8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0)
                  {
                    p_Var46 = local_cb8._M_impl.super__Rb_tree_header._M_header._M_parent;
                    do {
                      iVar17 = *(int *)&((_Alloc_hider *)&p_Var46[1]._M_color)->_M_p;
                      if (*pkVar54 <= iVar17) {
                        p_Var39 = p_Var46;
                      }
                      p_Var46 = (_Base_ptr)
                                (&((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)&p_Var46->_M_left)->_M_allocated_capacity)[iVar17 < *pkVar54];
                    } while (p_Var46 != (_Base_ptr)0x0);
                  }
                  p_Var46 = p_Var38;
                  if ((p_Var39 != p_Var38) &&
                     (p_Var46 = p_Var39, *pkVar54 < (int)p_Var39[1]._M_color)) {
                    p_Var46 = p_Var38;
                  }
                  if (p_Var46 == p_Var38) {
                    pmVar35 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)&local_cb8,pkVar54);
                    *pmVar35 = 1;
                  }
                  else {
                    pmVar35 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)&local_cb8,pkVar54);
                    iVar17 = *pmVar35;
                    pmVar35 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)&local_cb8,
                                           (key_type *)(paVar36->_M_allocated_capacity + 0x310));
                    *pmVar35 = iVar17 + 1;
                  }
                  plVar32 = (long *)std::ostream::operator<<
                                              ((ostream *)local_788,
                                               *(int *)(paVar36->_M_allocated_capacity + 0x310));
                  std::ios::widen((char)*(undefined8 *)(*plVar32 + -0x18) + (char)plVar32);
                }
                std::ostream::put((char)plVar32);
                std::ostream::flush();
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_1038);
                paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)paVar36 + 8);
                if (paVar36 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1070) {
                  paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1040[1];
                  local_1040 = local_1040 + 1;
                  local_1070 = (pointer)(paVar36->_M_local_buf + 0x200);
                }
              } while (paVar36 !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(this_01->_M_impl).super__Deque_impl_data._M_finish._M_cur);
            }
            std::ofstream::close();
            std::ofstream::close();
            std::ofstream::close();
            std::ofstream::close();
            if (bVar3 == false) {
              paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_1038 + 0x10);
              local_1038._0_8_ = paVar36;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1038,local_1100,local_1100 + local_10f8);
              std::__cxx11::string::append(local_1038);
              plVar32 = (long *)std::__cxx11::string::append(local_1038);
              paVar58 = &local_1060.field_2;
              psVar47 = (size_type *)(plVar32 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar32 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar47) {
                local_1060.field_2._M_allocated_capacity = *psVar47;
                local_1060.field_2._8_8_ = plVar32[3];
                local_1060._M_dataplus._M_p = (pointer)paVar58;
              }
              else {
                local_1060.field_2._M_allocated_capacity = *psVar47;
                local_1060._M_dataplus._M_p = (pointer)*plVar32;
              }
              local_1060._M_string_length = plVar32[1];
              *plVar32 = (long)psVar47;
              plVar32[1] = 0;
              *(undefined1 *)(plVar32 + 2) = 0;
              remove(local_1060._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1060._M_dataplus._M_p != paVar58) {
                operator_delete(local_1060._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1038._0_8_ != paVar36) {
                operator_delete((void *)local_1038._0_8_);
              }
              local_1038._0_8_ = paVar36;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1038,local_1100,local_1100 + local_10f8);
              std::__cxx11::string::append(local_1038);
              plVar32 = (long *)std::__cxx11::string::append(local_1038);
              psVar47 = (size_type *)(plVar32 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar32 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar47) {
                local_1060.field_2._M_allocated_capacity = *psVar47;
                local_1060.field_2._8_8_ = plVar32[3];
                local_1060._M_dataplus._M_p = (pointer)paVar58;
              }
              else {
                local_1060.field_2._M_allocated_capacity = *psVar47;
                local_1060._M_dataplus._M_p = (pointer)*plVar32;
              }
              local_1060._M_string_length = plVar32[1];
              *plVar32 = (long)psVar47;
              plVar32[1] = 0;
              *(undefined1 *)(plVar32 + 2) = 0;
              remove(local_1060._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1060._M_dataplus._M_p != paVar58) {
                operator_delete(local_1060._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1038._0_8_ != paVar36) {
                operator_delete((void *)local_1038._0_8_);
              }
              local_1038._0_8_ = paVar36;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1038,local_1100,local_1100 + local_10f8);
              std::__cxx11::string::append(local_1038);
              plVar32 = (long *)std::__cxx11::string::append(local_1038);
              psVar47 = (size_type *)(plVar32 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar32 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar47) {
                local_1060.field_2._M_allocated_capacity = *psVar47;
                local_1060.field_2._8_8_ = plVar32[3];
                local_1060._M_dataplus._M_p = (pointer)paVar58;
              }
              else {
                local_1060.field_2._M_allocated_capacity = *psVar47;
                local_1060._M_dataplus._M_p = (pointer)*plVar32;
              }
              local_1060._M_string_length = plVar32[1];
              *plVar32 = (long)psVar47;
              plVar32[1] = 0;
              *(undefined1 *)(plVar32 + 2) = 0;
              remove(local_1060._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1060._M_dataplus._M_p != paVar58) {
                operator_delete(local_1060._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1038._0_8_ != paVar36) {
                operator_delete((void *)local_1038._0_8_);
              }
              local_1038._0_8_ = paVar36;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1038,local_1100,local_1100 + local_10f8);
              std::__cxx11::string::append(local_1038);
              plVar32 = (long *)std::__cxx11::string::append(local_1038);
              psVar47 = (size_type *)(plVar32 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar32 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar47) {
                local_1060.field_2._M_allocated_capacity = *psVar47;
                local_1060.field_2._8_8_ = plVar32[3];
                local_1060._M_dataplus._M_p = (pointer)paVar58;
              }
              else {
                local_1060.field_2._M_allocated_capacity = *psVar47;
                local_1060._M_dataplus._M_p = (pointer)*plVar32;
              }
              local_1060._M_string_length = plVar32[1];
              *plVar32 = (long)psVar47;
              plVar32[1] = 0;
              *(undefined1 *)(plVar32 + 2) = 0;
              remove(local_1060._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1060._M_dataplus._M_p != paVar58) {
                operator_delete(local_1060._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1038._0_8_ != paVar36) {
                operator_delete((void *)local_1038._0_8_);
              }
            }
            std::
            _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::~_Rb_tree(&local_c10);
            std::
            _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::~_Rb_tree(&local_cb8);
            std::
            _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)local_fc8);
            std::
            _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::~_Rb_tree(&local_f88);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::~_Rb_tree(&local_f38);
            uVar40 = _sqrt;
            paVar36 = _VTT;
            local_388 = (undefined1  [8])_VTT;
            *(undefined8 *)(local_388 + *(long *)((long)_VTT + -0x18)) = _sqrt;
            std::filebuf::~filebuf((filebuf *)(local_388 + 8));
            std::ios_base::~ios_base(aiStack_290);
            local_788 = (undefined1  [8])paVar36;
            *(undefined8 *)(local_788 + *(long *)((long)paVar36 + -0x18)) = uVar40;
            std::filebuf::~filebuf((filebuf *)(local_788 + 8));
            std::ios_base::~ios_base(aiStack_690);
            local_588 = (undefined1  [8])paVar36;
            *(undefined8 *)(local_588 + *(long *)((long)paVar36 + -0x18)) = uVar40;
            std::filebuf::~filebuf((filebuf *)&pbStack_580);
            std::ios_base::~ios_base((ios_base *)(local_578[0]._M_local_buf + 0xe8));
            local_a68 = (undefined1  [8])paVar36;
            *(undefined8 *)(local_a68 + *(long *)((long)paVar36 + -0x18)) = uVar40;
            std::filebuf::~filebuf((filebuf *)&local_a60);
            std::ios_base::~ios_base(local_970);
          }
          printReads((ostream *)local_f00,
                     (deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)this_01,
                     (int)local_f08);
          if (local_1072 != '\0') {
            local_b60._M_dataplus._M_p = (pointer)&local_b60.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b60,local_1100,local_1100 + local_10f8);
            printBAM(&local_b60,
                     (deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)this_01,
                     (SamHeader *)local_188,&local_c88,local_f98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b60._M_dataplus._M_p != &local_b60.field_2) {
              operator_delete(local_b60._M_dataplus._M_p);
            }
            if (bVar3 != false) {
              local_588 = (undefined1  [8])local_578;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_588,local_1100,local_1100 + local_10f8);
              std::__cxx11::string::append(local_588);
              std::ofstream::ofstream(local_a68,(string *)local_588,_S_out);
              if (local_588 != (undefined1  [8])local_578) {
                operator_delete((void *)local_588);
              }
              printConsistingReads
                        ((ostream *)local_a68,
                         (deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)this_01,
                         local_f98);
              local_a68 = (undefined1  [8])_VTT;
              *(undefined8 *)(local_a68 + *(long *)((long)_VTT + -0x18)) = _sqrt;
              std::filebuf::~filebuf((filebuf *)&local_a60);
              std::ios_base::~ios_base(local_970);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"final: ",7);
          poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
          std::ostream::put((char)poVar19);
          std::ostream::flush();
          ppAVar31 = (this_01->_M_impl).super__Deque_impl_data._M_start._M_cur;
          ppAVar8 = (this_01->_M_impl).super__Deque_impl_data._M_finish._M_cur;
          if (ppAVar31 != ppAVar8) {
            ppAVar50 = (this_01->_M_impl).super__Deque_impl_data._M_start._M_last;
            pppAVar23 = (this_01->_M_impl).super__Deque_impl_data._M_start._M_node;
            do {
              this_00 = *ppAVar31;
              if (this_00 != (AlignmentRecord *)0x0) {
                AlignmentRecord::~AlignmentRecord(this_00);
                operator_delete(this_00);
              }
              ppAVar31 = ppAVar31 + 1;
              if (ppAVar31 == ppAVar50) {
                ppAVar31 = pppAVar23[1];
                pppAVar23 = pppAVar23 + 1;
                ppAVar50 = ppAVar31 + 0x40;
              }
            } while (ppAVar31 != ppAVar8);
          }
          std::_Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::~_Deque_base
                    (this_01);
          operator_delete(this_01);
          pNVar29 = local_c68;
          pLVar30 = local_1068;
          if (local_1008 != (long *)0x0) {
            std::ofstream::close();
            (**(code **)(*local_1008 + 8))();
          }
          (*(pNVar29->super_EdgeCalculator)._vptr_EdgeCalculator[1])(pNVar29);
          if (pLVar30 != (LogWriter *)0x0) {
            (*pLVar30->_vptr_LogWriter[1])(pLVar30);
          }
          (*(this_03->super_CliqueFinder)._vptr_CliqueFinder[1])();
          lVar24 = std::cout;
          *(undefined8 *)(BamTools::SamReadGroup::SamReadGroup + *(long *)(std::cout + -0x18)) = 3;
          *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar24 + -0x18)) =
               *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar24 + -0x18)) &
               0xfffffefb | 4;
          cVar28 = clock();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"time: ",6);
          poVar19 = std::ostream::_M_insert<double>((double)(cVar28 - local_c60) / 1000000.0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
          std::ostream::put((char)poVar19);
          std::ostream::flush();
          local_f00 = (undefined1  [8])_VTT;
          *(undefined8 *)(local_f00 + *(long *)((long)_VTT + -0x18)) = _sqrt;
          std::filebuf::~filebuf((filebuf *)&local_ef8);
          std::ios_base::~ios_base(local_e08);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::~_Rb_tree(&local_b90);
          local_bb0._vptr_CliqueCollector = (_func_int **)&PTR__CliqueCollector_001b88b8;
          if (&(local_bb0.superReads)->
               super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> !=
              (_Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)0x0) {
            std::_Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::~_Deque_base
                      (&(local_bb0.superReads)->
                        super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>);
            operator_delete(local_bb0.superReads);
          }
          uVar18 = 0;
        }
        else {
          local_f00 = (undefined1  [8])0xbff0000000000000;
          local_a68 = (undefined1  [8])0xbff0000000000000;
          bVar16 = read_mean_and_sd(&local_10e0,(double *)local_f00,(double *)local_a68);
          if (!bVar16) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error reading \"",0xf);
            poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,local_10e0._M_dataplus._M_p,
                                 local_10e0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\".",2);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
            std::ostream::put((char)poVar19);
            std::ostream::flush();
            this_02 = (GaussianEdgeCalculator *)0x0;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Null distribution: mean ",0x18);
            auVar55 = local_f00;
            poVar19 = std::ostream::_M_insert<double>((double)local_f00);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,", sd ",5);
            local_1080 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_a68;
            poVar19 = std::ostream::_M_insert<double>((double)local_a68);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
            std::ostream::put((char)poVar19);
            std::ostream::flush();
            this_02 = (GaussianEdgeCalculator *)operator_new(0x30);
            GaussianEdgeCalculator::GaussianEdgeCalculator
                      (this_02,0.2,(double)auVar55,(double)local_1080);
          }
          uVar18 = (uint)!bVar16;
          if (bVar16) goto LAB_001440f9;
        }
        pvVar14 = local_f90;
        if (local_f90 != (vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_> *)0x0) {
          if (*(void **)&local_f90->field_0x0 != (void *)0x0) {
            operator_delete(*(void **)&local_f90->field_0x0);
          }
          operator_delete(pvVar14);
        }
        std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::~vector(&local_c88);
        BamTools::SamHeader::~SamHeader((SamHeader *)local_188);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_cd8);
        std::
        _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_aa0);
LAB_00145a9e:
        std::
        _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_7f8);
        std::
        _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_7c0);
        if (local_c50 != &local_c40) {
          operator_delete(local_c50);
        }
        if (local_cf8 != local_ce8) {
          operator_delete(local_cf8);
        }
        if (local_f58 != local_f48) {
          operator_delete(local_f58);
        }
        if (local_c30 != &local_c20) {
          operator_delete(local_c30);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_10e0._M_dataplus._M_p != &local_10e0.field_2) {
          operator_delete(local_10e0._M_dataplus._M_p);
        }
        if (local_10c0 != local_10b0) {
          operator_delete(local_10c0);
        }
        if (local_1100 != local_10f0) {
          operator_delete(local_1100);
        }
        if (local_10a0 != local_1090) {
          operator_delete(local_10a0);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
        ::~_Rb_tree(&local_ff8);
        return uVar18;
      }
      goto LAB_00145bc4;
    }
    local_f00 = (undefined1  [8])&local_ef0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f00,"--doc_haplotypes","");
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
                            *)&local_ff8,(key_type *)local_f00);
    docopt::value::throwIfNotKind(pmVar21,String);
    paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pmVar21->variant).strList.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    iVar17 = *piVar22;
    *piVar22 = 0;
    lVar24 = strtol(paVar36->_M_local_buf,(char **)local_a68,10);
    if (local_a68 != (undefined1  [8])paVar36) {
      if ((lVar24 - 0x80000000U < 0xffffffff00000000) || (*piVar22 == 0x22)) goto LAB_00145bdc;
      if (*piVar22 == 0) {
        *piVar22 = iVar17;
      }
      local_f08 = lVar24;
      if (local_f00 != (undefined1  [8])&local_ef0) {
        operator_delete((void *)local_f00);
      }
      goto LAB_00143364;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_00145bdc:
  uVar40 = std::__throw_out_of_range("stoi");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038._0_8_ != paVar36) {
    operator_delete((void *)local_1038._0_8_);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_c10);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_cb8);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)local_fc8);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_f88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_f38);
  std::ofstream::~ofstream(local_388);
  std::ofstream::~ofstream(local_788);
  std::ofstream::~ofstream(local_588);
  std::ofstream::~ofstream(local_a68);
  std::ofstream::~ofstream(local_f00);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_b90);
  CliqueCollector::~CliqueCollector(&local_bb0);
  if (local_f90 != (vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_> *)0x0) {
    std::default_delete<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>_>::
    operator()((default_delete<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>_>
                *)&local_f90,local_f90);
  }
  std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::~vector(&local_c88);
  BamTools::SamHeader::~SamHeader((SamHeader *)local_188);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_cd8);
  std::
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_aa0);
  std::
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_7f8);
  std::
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_7c0);
  if (local_c50 != &local_c40) {
    operator_delete(local_c50);
  }
  if (local_cf8 != local_ce8) {
    operator_delete(local_cf8);
  }
  if (local_f58 != local_f48) {
    operator_delete(local_f58);
  }
  if (local_c30 != &local_c20) {
    operator_delete(local_c30);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10e0._M_dataplus._M_p != &local_10e0.field_2) {
    operator_delete(local_10e0._M_dataplus._M_p);
  }
  if (local_10c0 != local_10b0) {
    operator_delete(local_10c0);
  }
  if (local_1100 != local_10f0) {
    operator_delete(local_1100);
  }
  if (local_10a0 != local_1090) {
    operator_delete(local_10a0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
  ::~_Rb_tree(&local_ff8);
  _Unwind_Resume(uVar40);
}

Assistant:

int main(int argc, char* argv[]) {
    cout<<"in main"<<endl;
    map<std::string, docopt::value> args
        = docopt::docopt(USAGE,
                         { argv + 1, argv + argc },
                         false);
    for(auto elem : args)
    {
    cout << elem.first << " " << elem.second << "\n";
    }

    // PARAMETERS
    string bamfile = args["<bamfile>"].asString();
    string outfile = "chromatypes.fasta";
    if (args["<output>"]) outfile = args["<output>"].asString();
    double edge_quasi_cutoff_cliques = 0.99; //stod(args["--edge_quasi_cutoff_cliques"].asString());
    double edge_quasi_cutoff_single = 0.95; //stod(args["--edge_quasi_cutoff_single"].asString());
    double edge_quasi_cutoff_mixed = 0.97; //stod(args["--edge_quasi_cutoff_mixed"].asString());
    double Q = 0.9;//stod(args["--random_overlap_quality"].asString());
    double overlap_cliques = 0.9; //stod(args["--min_overlap_cliques"].asString());
    double overlap_single = 0.6;//stod(args["--min_overlap_single"].asString());
    bool frameshift_merge; // args["--frame_shift_merge"].asBool();
    string allel_frequencies_path = "";
    if (args["--allel_frequencies"]) allel_frequencies_path = args["--allel_frequencies"].asString();
    string mean_and_sd_filename = "";
    if (args["--mean_and_sd_filename"]) mean_and_sd_filename = args["--mean_and_sd_filename"].asString();
    string indel_edge_cutoff;
    double indel_edge_sig_level = 0.2; //stod(args["--indel_edge_sig_level"].asString());
    string indel_output_file = "";
    if (args["--call_indels"]) indel_output_file = args["--call_indels"].asString();
    int iterations = stoi(args["--iterations"].asString());
    double filter = 0.0;// stod(args["--filter"].asString());
    double significance = 3.0; //stod(args["--significance"].asString());
    bool filter_singletons = args["--no_singletons"].asBool();
    string logfile = "";
    if (args["--log"]) logfile = args["--log"].asString();
    int doc_haplotypes = 0;
    if (args["--doc_haplotypes"]) doc_haplotypes = stoi(args["--doc_haplotypes"].asString());
    bool noProb0 = false; //args["--noProb0"].asBool();
    //-ot CHAR --output_type=CHAR
    bool bam = args["--bam"].asBool();
    bool analysisFiles = args["--analysisFiles"].asBool();
    bool nome = args["--nome"].asBool();
    double nomeParam = stod(args["--nomeParam"].asString());
    double uniqueSupportFilter = stod(args["--uniqueSupportFilter"].asString());
    double minOverlap = stod(args["--minOverlap"].asString());
    string reference_path;
    if (args["--ref"]) reference_path = args["--ref"].asString();

    //Read switch rates for both forward and reverse strand
    std::unordered_map<int, double> switchRateFS = readSwitchRateFile(args["--FS"].asString());
    std::unordered_map<int, double> switchRateRS = readSwitchRateFile(args["--RS"].asString());

    // END PARAMETERS

    bool call_indels = indel_output_file.size() > 0;
    if (call_indels && (mean_and_sd_filename.size() == 0)) {
        //cout<<"s1: "<<s1<<endl;
        //cout<<"s2: "<<s2<<endl;
        cerr << "Error: when using option -I, option -M must also be given." << endl;
        return 1;
    }

    //read allel frequency distributions
    std::unordered_map<int, double> simpson_map;
    unsigned int maxPosition2 = 0;
    //cerr << "PARSE PRIOR";
    cerr.flush();
    if (allel_frequencies_path.size() > 0) {
        ifstream ia(allel_frequencies_path.c_str());
        string ia_line;
        while (getline(ia, ia_line)) {
            std::vector<std::string> words;
            trim_right(ia_line);
            boost::split(words, ia_line, boost::is_any_of("\t"), boost::token_compress_on);

            std::vector<std::string> insertion_words;
            boost::split(insertion_words, words[0], boost::is_any_of("\\."), boost::token_compress_on);
            if (insertion_words.size() > 1) {
            } else {
                simpson_map[atoi(words[0].c_str())] = std::log10(pow(atof(words[1].c_str()),2)+pow(atof(words[2].c_str()),2)+pow(atof(words[3].c_str()),2)+pow(atof(words[4].c_str()),2));
                maxPosition2=atoi(words[0].c_str());
                //cerr << simpson_map[atoi(words[0].c_str())] << endl;
            }
        }
        ia.close();
    }
    //cout << "PARSE PRIOR: done" << endl;


    clock_t clock_start = clock();
    vector<string> originalReadNames;
    unsigned int maxPosition1;
    BamTools::SamHeader header;
    BamTools::RefVector references;
    deque<AlignmentRecord*>* reads = readBamFile(bamfile, originalReadNames,maxPosition1,header,references,reference_path);
    EdgeCalculator* edge_calculator = nullptr;
    EdgeCalculator* indel_edge_calculator = nullptr;
    unique_ptr<vector<mean_and_stddev_t> > readgroup_params(nullptr);
    maxPosition1 = (maxPosition1>maxPosition2) ? maxPosition1 : maxPosition2;

    if(nome){
        edge_calculator = new NoMeEdgeCalculator(nomeParam , switchRateFS , switchRateRS);
    }else{
        edge_calculator = new NewEdgeCalculator(Q, edge_quasi_cutoff_cliques, overlap_cliques, frameshift_merge, simpson_map, edge_quasi_cutoff_single, overlap_single, edge_quasi_cutoff_mixed, maxPosition1, noProb0);
    }
    if (call_indels) {
        double insert_mean = -1.0;
        double insert_stddev = -1.0;
        if (!read_mean_and_sd(mean_and_sd_filename, &insert_mean, &insert_stddev)) {
            cerr << "Error reading \"" << mean_and_sd_filename << "\"." << endl;
            return 1;
        }
        cerr << "Null distribution: mean " << insert_mean << ", sd " <<  insert_stddev << endl;
        indel_edge_calculator = new GaussianEdgeCalculator(indel_edge_sig_level,insert_mean,insert_stddev);
    }
    std::ofstream* indel_os = nullptr;
    if (call_indels) {
        indel_os = new ofstream(indel_output_file.c_str());
    }
    LogWriter* lw = nullptr;
    if (logfile != "") lw = new LogWriter(logfile);

    CliqueCollector collector(lw);
    CliqueFinder* clique_finder;

//    if (args["bronkerbosch"].asBool()) {
//        clique_finder = new BronKerbosch(*edge_calculator, collector, lw);
//    } else {
//        clique_finder = new CLEVER(*edge_calculator, collector, lw);
//    }

    clique_finder = new CLEVER(*edge_calculator, collector, lw);
    if (indel_edge_calculator != 0) {
        clique_finder->setSecondEdgeCalculator(indel_edge_calculator);
    }
    ofstream* reads_ofstream = 0;




//    cout<<"befor main loop"<<endl;
    // Main loop
    int ct = 0;
    double stdev = 1.0;
    auto filter_fn = [&](unique_ptr<AlignmentRecord>& read, int size) {

        return (ct == 1 and filter_singletons and read->getReadCount() <= 1) or (ct > 1 and significance != 0.0 and read->getProbability() < 1.0 / size - significance*stdev);
    };
    int edgecounter = 0;
    int nonEdgeCounter = 0;

    cout << "start: " << originalReadNames.size();
    int prevReadsSize = 0;
    int numAllowedGCPos = minOverlap;
    std::map<string,int> appearanceMap;
    while (ct != iterations) {
        if(appearanceMap.size()!=0){
            appearanceMap.clear();
        }
        clique_finder->initialize(&appearanceMap);

        if (lw != nullptr) lw->initialize();
        int size = reads->size();
        prevReadsSize = reads->size();


        while(not reads->empty()) {

            assert(reads->front() != nullptr);

            unique_ptr<AlignmentRecord> al_ptr(reads->front());

            reads->pop_front();
            if (filter_fn(al_ptr,size)) continue;
//            if(ct>0){
//                cout<<al_ptr->getName()<<endl;
//            }
            clique_finder->addAlignment(al_ptr,edgecounter,nonEdgeCounter,numAllowedGCPos,ct);

            //cout << "addAlignment " << ct << endl;

        }
        if(numAllowedGCPos>2){
            numAllowedGCPos--;
        }

        cout << "\tedges: " << edgecounter;
        cout << "\tnonEdges: " << nonEdgeCounter<<endl;


        delete reads;

        clique_finder->finish();
        reads = collector.finish();
        if (lw != nullptr) lw->finish();

        stdev = setProbabilities(*reads);
        if (clique_finder->hasConverged()) break;
        cout << ct++ << ": " << reads->size();
        edgecounter = 0;
        nonEdgeCounter = 0;
    }

    // Filter superreads according to read probability
    if (filter > 0.0) {
        auto filter_fn = [&](AlignmentRecord* al) { return al->getProbability() < filter;};
        auto new_end_it = std::remove_if(reads->begin(), reads->end(), filter_fn);
        for (auto it = new_end_it; it != reads->end(); it++) {
            delete *it;
            *it = nullptr;
        }
        reads->erase(new_end_it, reads->end());
    }
    ofstream os(outfile + ".fasta", std::ofstream::out);
    setProbabilities(*reads);
    //Filter superreads according to unique support information
    if(uniqueSupportFilter > -1){
        ofstream osUniqueError(outfile + "UniqueError" + ".txt",std::ofstream::out);
        ofstream osUniqueTrue(outfile + "UniqueTrue" + ".txt",std::ofstream::out);
        ofstream osSupportError(outfile + "SupportError" + ".txt",std::ofstream::out);
        ofstream osSupportTrue(outfile + "SupportTrue" + ".txt",std::ofstream::out);
        std::map<string,int> readCountMap;
        for (auto it = reads->begin(); it != reads->end(); it++) {
            vector<string> consistingReads = (*it)->getConsistingReads();
            //cout<<(*it)->getName()<<"    "<<endl;
            for(auto s : consistingReads){
                if((s.find("End")==std::string::npos) && (s.find("Clique")==std::string::npos)){
                    string token = s;
                    token.erase(token.begin(), std::find_if(token.begin(), token.end(),
                                std::not1(std::ptr_fun<int, int>(std::isspace))));
                    token.erase(std::find_if(token.rbegin(), token.rend(),
                                std::not1(std::ptr_fun<int, int>(std::isspace))).base(), token.end());
                    if(readCountMap.find(token)!=readCountMap.end()){
                        readCountMap.operator[](token) = readCountMap.operator[](token) + 1;
                    }else{
                        readCountMap.operator[](token) = 1;
                    }
                }
            }
        }


        int errorCount = 0;
        int totalCount = 0;
        int errorWithNoUnique = 0;
        int trueWithNoUnique = 0;

        std::map<int,int> trueReadsSupportMap;
        std::map<int,int> trueReadsUniqueSupportMap;
        std::map<int,int> errorReadsSupportMap;
        std::map<int,int> errorReadsUniqueSupportMap;


        for (auto it = reads->begin(); it != reads->end(); it++) {
            vector<string> consistingReads = (*it)->getConsistingReads();
            //cout<<(*it)->getName()<<"    "<<endl;
            int chroma1 = 0;
            int chroma2 = 0;
            for(auto s : consistingReads){
                if((s.find("End")==std::string::npos) && (s.find("Clique")==std::string::npos)){
                    if(readCountMap[s]>1){
                        (*it)->support += 1;
                    }else if(readCountMap[s]==1){
                        (*it)->uniqueSupport += 1;
                        (*it)->support += 1;
                    }

                    if(s.find("chroma1")!=string::npos) chroma1++;
                    if(s.find("chroma2")!=string::npos) chroma2++;
                }
            }

            if(chroma1!=0 && chroma2!=0){
              errorCount++;
              if((*it)->uniqueSupport==uniqueSupportFilter)errorWithNoUnique++;
              if(errorReadsUniqueSupportMap.find((*it)->uniqueSupport)!=errorReadsUniqueSupportMap.end()){
                  errorReadsUniqueSupportMap[(*it)->uniqueSupport] = errorReadsUniqueSupportMap[(*it)->uniqueSupport] + 1;
              }else{
                  errorReadsUniqueSupportMap[(*it)->uniqueSupport] = 1;
              }
              osUniqueError<<(*it)->uniqueSupport<<endl;
              if(errorReadsSupportMap.find((*it)->support)!=errorReadsSupportMap.end()){
                  errorReadsSupportMap[(*it)->support] = errorReadsSupportMap[(*it)->support] + 1;
              }else{
                  errorReadsSupportMap[(*it)->support] = 1;
              }
              osSupportError<<(*it)->support<<endl;
            }else{
               if((*it)->uniqueSupport==uniqueSupportFilter)trueWithNoUnique++;
               if(trueReadsUniqueSupportMap.find((*it)->uniqueSupport)!=trueReadsUniqueSupportMap.end()){
                   trueReadsUniqueSupportMap[(*it)->uniqueSupport] = trueReadsUniqueSupportMap[(*it)->uniqueSupport] + 1;
               }else{
                   trueReadsUniqueSupportMap[(*it)->uniqueSupport] = 1;
               }
               osUniqueTrue<<(*it)->uniqueSupport<<endl;
               if(trueReadsSupportMap.find((*it)->support)!=trueReadsSupportMap.end()){
                   trueReadsSupportMap[(*it)->support] = trueReadsSupportMap[(*it)->support] + 1;
               }else{
                   trueReadsSupportMap[(*it)->support] = 1;
               }
               osSupportTrue<<(*it)->support<<endl;
            }
            totalCount++;
        }

        osUniqueError.close();
        osSupportError.close();
        osUniqueTrue.close();
        osSupportTrue.close();
        if(!analysisFiles){
            std::remove((outfile + "UniqueError" + ".txt").c_str());
            std::remove((outfile + "UniqueTrue" + ".txt").c_str());
            std::remove((outfile + "SupportError" + ".txt").c_str());
            std::remove((outfile + "SupportTrue" + ".txt").c_str());
        }
    }

    printReads(os, *reads, doc_haplotypes);

    if (bam){
        //cout<<outfile+".bam"<<endl;
//        ofstream os2(outfile + ".bam",std::ofstream::out);
        printBAM(outfile,*reads,header,references,uniqueSupportFilter);
        if(analysisFiles){
            ofstream os3(outfile + "Reads.txt",std::ofstream::out);
            printConsistingReads(os3, *reads,uniqueSupportFilter);
        }
    }


    cout << "final: " << reads->size() << endl;

    for (auto&& r : *reads) {

        delete r;
    }

    delete reads;

    if (indel_os != nullptr) {
        indel_os->close();
        delete indel_os;
    }
    if (edge_calculator != nullptr) delete edge_calculator;
    if (lw != nullptr) delete lw;
    if (clique_finder != nullptr) delete clique_finder;
    if (reads_ofstream != nullptr) {
        delete reads_ofstream;
    }
    cout.precision(3);
    cout << std::fixed;
    double cpu_time = (double) (clock() - clock_start) / CLOCKS_PER_SEC;
    cout << "time: " <<  cpu_time << endl;
    return 0;
}